

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

const_iterator * __thiscall
ft::mapBase<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>::lower_bound
          (const_iterator *__return_storage_ptr__,
          mapBase<int,_float,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_> *this,
          key_type *k)

{
  rbtree *prVar1;
  treeNode<ft::pair<const_int,_float>_> *ptVar2;
  treeNode<ft::pair<const_int,_float>_> *ptVar3;
  const_iterator *it;
  
  prVar1 = &(this->
            super_treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
            ).m_tree;
  ptVar3 = ((this->
            super_treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
            ).m_tree.m_first)->parent;
  (__return_storage_ptr__->
  super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
  ).m_tree = prVar1;
  (__return_storage_ptr__->
  super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
  ).m_node = ptVar3;
  (__return_storage_ptr__->
  super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
  )._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00118a20;
  while( true ) {
    ptVar2 = (this->
             super_treeBase<int,_float,_ft::pair<const_int,_float>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_float>_>_>
             ).m_tree.m_last;
    if (ptVar3 == ptVar2) {
      (__return_storage_ptr__->
      super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
      ).m_tree = prVar1;
      (__return_storage_ptr__->
      super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
      ).m_node = ptVar2;
      (__return_storage_ptr__->
      super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
      )._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00118a20;
      return __return_storage_ptr__;
    }
    if (*k <= (ptVar3->value).first) break;
    treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
    ::operator++(&__return_storage_ptr__->
                  super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
                );
    ptVar3 = (__return_storage_ptr__->
             super_treeIterator<ft::pair<const_int,_float>,_ft::allocator<ft::treeNode<ft::pair<const_int,_float>_>_>_>
             ).m_node;
  }
  return __return_storage_ptr__;
}

Assistant:

const_iterator	lower_bound(key_type const & k) const
	{
		for (const_iterator it = this->begin(); it != this->end(); ++it)
		{
			if (!this->key_comp()(it->first, k)) return it;
		}
		return this->end();
	}